

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-tree.c++
# Opt level: O2

char * __thiscall kj::StringTree::flattenTo(StringTree *this,char *target,char *limit)

{
  Branch *pBVar1;
  size_t sVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  char *pcVar6;
  StringTree *this_00;
  ulong uVar7;
  char *local_48;
  anon_class_16_2_77190bd5 local_40;
  
  local_40.target = &local_48;
  pBVar1 = (this->branches).ptr;
  uVar7 = 0;
  local_48 = target;
  local_40.limit = limit;
  for (lVar5 = (this->branches).size_ << 6; this_00 = &pBVar1->content, lVar5 != 0;
      lVar5 = lVar5 + -0x40) {
    uVar3 = *(ulong *)((long)(this_00 + -1) + 0x30) - uVar7;
    if (uVar7 <= *(ulong *)((long)(this_00 + -1) + 0x30) && uVar3 != 0) {
      pcVar6 = "";
      if ((this->text).content.size_ != 0) {
        pcVar6 = (this->text).content.ptr;
      }
      uVar4 = (long)limit - (long)local_48;
      if (uVar3 < (ulong)((long)limit - (long)local_48)) {
        uVar4 = uVar3;
      }
      memcpy(local_48,pcVar6 + uVar7,uVar4);
      local_48 = local_48 + uVar4;
      uVar7 = *(ulong *)((long)(this_00 + -1) + 0x30);
    }
    visit<kj::StringTree::flattenTo(char*,char*)const::__0&>(this_00,&local_40);
    pBVar1 = (Branch *)(this_00 + 1);
  }
  sVar2 = (this->text).content.size_;
  uVar3 = 0;
  if (sVar2 != 0) {
    uVar3 = sVar2 - 1;
  }
  uVar4 = uVar3 - uVar7;
  if (uVar7 <= uVar3 && uVar4 != 0) {
    if (sVar2 == 0) {
      pcVar6 = "";
    }
    else {
      pcVar6 = (this->text).content.ptr;
    }
    uVar3 = (long)limit - (long)local_48;
    if (uVar4 < (ulong)((long)limit - (long)local_48)) {
      uVar3 = uVar4;
    }
    memcpy(local_48,pcVar6 + uVar7,uVar3);
    local_48 = local_48 + uVar3;
  }
  return local_48;
}

Assistant:

char* StringTree::flattenTo(char* __restrict__ target, char* limit) const {
  visit([&target,limit](ArrayPtr<const char> text) {
    size_t size = kj::min(text.size(), limit - target);
    memcpy(target, text.begin(), size);
    target += size;
  });
  return target;
}